

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O2

int __thiscall
CVmObjTads::getp_create_clone(CVmObjTads *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  vm_obj_id_t vVar4;
  short sVar5;
  long lVar6;
  CVmObjPageEntry *this_00;
  undefined2 *puVar7;
  ulong uVar8;
  bool bVar9;
  
  if (getp_create_clone(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar3 = __cxa_guard_acquire(&getp_create_clone(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar3 != 0) {
      getp_create_clone::desc.min_argc_ = 0;
      getp_create_clone::desc.opt_argc_ = 0;
      getp_create_clone::desc.varargs_ = 0;
      __cxa_guard_release(&getp_create_clone(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  pcVar1 = (this->super_CVmObject).ext_;
  iVar3 = CVmObject::get_prop_check_argc(retval,argc,&getp_create_clone::desc);
  if (iVar3 == 0) {
    vVar4 = create(0,*(ushort *)((this->super_CVmObject).ext_ + 0x24),*(ushort *)(pcVar1 + 0x22));
    this_00 = G_obj_table_X.pages_[vVar4 >> 0xc] + (vVar4 & 0xfff);
    lVar6 = 0x28;
    for (uVar8 = 0; pcVar2 = (this->super_CVmObject).ext_, uVar8 < *(ushort *)(pcVar2 + 0x24);
        uVar8 = uVar8 + 1) {
      set_sc((CVmObjTads *)this_00,(ushort)uVar8,*(vm_obj_id_t *)(pcVar2 + lVar6));
      lVar6 = lVar6 + 0x10;
    }
    sVar5 = *(short *)(pcVar1 + 0x22);
    puVar7 = *(undefined2 **)(pcVar1 + 0x18);
    while (bVar9 = sVar5 != 0, sVar5 = sVar5 + -1, bVar9) {
      (**(code **)(*(long *)&this_00->ptr_ + 0x60))(this_00,0,self,*puVar7,puVar7 + 0xc);
      puVar7 = puVar7 + 0x14;
    }
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar4;
  }
  return 1;
}

Assistant:

int CVmObjTads::getp_create_clone(VMG_ vm_obj_id_t self,
                                  vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(0);
    vm_obj_id_t new_obj;
    CVmObjTads *tobj;
    vm_tadsobj_prop *entry;
    ushort i;
    vm_tadsobj_hdr *hdr = get_hdr();

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* 
     *   create a new object with the same number of superclasses as I have,
     *   and with space for all of my properties 
     */
    new_obj = create(vmg_ FALSE, get_sc_count(), hdr->prop_entry_free);
    tobj = (CVmObjTads *)vm_objp(vmg_ new_obj);

    /* copy my superclass list to the new object */
    for (i = 0 ; i < get_sc_count() ; ++i)
        tobj->set_sc(vmg_ i, get_sc(i));

    /* copy my properties to the new object */
    for (i = hdr->prop_entry_free, entry = hdr->prop_entry_arr ;
         i != 0 ; --i, ++entry)
    {
        /* 
         *   Store the property in the new object.  We don't need to store
         *   undo for the property, as the object is entirely new since the
         *   last savepoint (as there can't have been a savepoint while we've
         *   been working, obviously).
         */
        tobj->set_prop(vmg_ 0, self, entry->prop, &entry->val);
    }

    /* the return value is the new object ID */
    retval->set_obj(new_obj);

    /* handled */
    return TRUE;
}